

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O1

void __thiscall FPatchTexture::MakeTexture(FPatchTexture *this)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  BYTE *pBVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  FResourceFile **ppFVar12;
  uint *__dest;
  FMemLump lump;
  BYTE remaptable [256];
  FWadCollection local_140 [3];
  
  FWadCollection::ReadLump(local_140,0x1c74350);
  ppFVar12 = (FResourceFile **)0x0;
  if (*(int *)((long)local_140[0].Files.Array + -0xc) != 0) {
    ppFVar12 = local_140[0].Files.Array;
  }
  iVar4 = FWadCollection::LumpLength(&Wads,(this->super_FTexture).SourceLump);
  if (((this->super_FTexture).field_0x31 & 2) == 0) {
    __dest = (uint *)GPalette.Remap;
  }
  else {
    __dest = &local_140[0].Files.Most;
    memcpy(__dest,GPalette.Remap,0x100);
    local_140[0].Files.Most._0_1_ = 0;
  }
  uVar2 = (this->super_FTexture).Width;
  uVar3 = (this->super_FTexture).Height;
  if (this->hackflag == true) {
    pBVar5 = (BYTE *)operator_new__((ulong)uVar3 * (ulong)uVar2);
    this->Pixels = pBVar5;
    if ((this->super_FTexture).Width != 0) {
      uVar6 = 0;
      do {
        uVar2 = (this->super_FTexture).Height;
        if (uVar2 != 0) {
          pbVar8 = (byte *)((long)ppFVar12 + (ulong)*(uint *)((long)ppFVar12 + uVar6 * 4 + 8) + 3);
          iVar4 = uVar2 + 1;
          do {
            *pBVar5 = *(BYTE *)((long)__dest + (ulong)*pbVar8);
            pBVar5 = pBVar5 + 1;
            pbVar8 = pbVar8 + 1;
            iVar4 = iVar4 + -1;
          } while (1 < iVar4);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (this->super_FTexture).Width);
    }
  }
  else {
    uVar6 = (ulong)(int)((uVar2 - 1) * (uint)uVar3 +
                        (1 << ((this->super_FTexture).HeightBits & 0x1f)));
    pBVar5 = (BYTE *)operator_new__(uVar6);
    this->Pixels = pBVar5;
    memset(pBVar5,0,uVar6);
    if ((this->super_FTexture).Width != 0) {
      pbVar8 = (byte *)((long)ppFVar12 + (long)iVar4 + -3);
      uVar6 = 0;
      do {
        pbVar7 = (byte *)((long)ppFVar12 + (ulong)*(uint *)((long)ppFVar12 + uVar6 * 4 + 8));
        if (pbVar7 < pbVar8) {
          uVar2 = (this->super_FTexture).Height;
          pBVar5 = this->Pixels;
          iVar4 = -1;
          do {
            bVar1 = *pbVar7;
            if (bVar1 == 0xff) break;
            if (iVar4 < (int)(uint)bVar1) {
              iVar4 = 0;
            }
            iVar4 = iVar4 + (uint)bVar1;
            bVar1 = pbVar7[1];
            if (bVar1 != 0) {
              uVar11 = (uint)(this->super_FTexture).Height;
              uVar9 = uVar11 - iVar4;
              if ((int)(iVar4 + (uint)bVar1) <= (int)uVar11) {
                uVar9 = (uint)bVar1;
              }
              if (0 < (int)uVar9) {
                uVar10 = 0;
                do {
                  pBVar5[uVar10 + (long)iVar4 + uVar2 * uVar6] =
                       *(BYTE *)((long)__dest + (ulong)pbVar7[uVar10 + 3]);
                  uVar10 = uVar10 + 1;
                } while (uVar10 < uVar9);
              }
            }
            pbVar7 = pbVar7 + (ulong)pbVar7[1] + 4;
          } while (pbVar7 < pbVar8);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (this->super_FTexture).Width);
    }
  }
  FMemLump::~FMemLump((FMemLump *)local_140);
  return;
}

Assistant:

void FPatchTexture::MakeTexture ()
{
	BYTE *remap, remaptable[256];
	int numspans;
	const column_t *maxcol;
	int x;

	FMemLump lump = Wads.ReadLump (SourceLump);
	const patch_t *patch = (const patch_t *)lump.GetMem();

	maxcol = (const column_t *)((const BYTE *)patch + Wads.LumpLength (SourceLump) - 3);

	// Check for badly-sized patches
#if 0	// Such textures won't be created so there's no need to check here
	if (LittleShort(patch->width) <= 0 || LittleShort(patch->height) <= 0)
	{
		lump = Wads.ReadLump ("-BADPATC");
		patch = (const patch_t *)lump.GetMem();
		Printf (PRINT_BOLD, "Patch %s has a non-positive size.\n", Name);
	}
	else if (LittleShort(patch->width) > 2048 || LittleShort(patch->height) > 2048)
	{
		lump = Wads.ReadLump ("-BADPATC");
		patch = (const patch_t *)lump.GetMem();
		Printf (PRINT_BOLD, "Patch %s is too big.\n", Name);
	}
#endif

	if (bNoRemap0)
	{
		memcpy (remaptable, GPalette.Remap, 256);
		remaptable[0] = 0;
		remap = remaptable;
	}
	else
	{
		remap = GPalette.Remap;
	}


	if (hackflag)
	{
		Pixels = new BYTE[Width * Height];
		BYTE *out;

		// Draw the image to the buffer
		for (x = 0, out = Pixels; x < Width; ++x)
		{
			const BYTE *in = (const BYTE *)patch + LittleLong(patch->columnofs[x]) + 3;

			for (int y = Height; y > 0; --y)
			{
				*out = remap[*in];
				out++, in++;
			}
		}
		return;
	}

	// Add a little extra space at the end if the texture's height is not
	// a power of 2, in case somebody accidentally makes it repeat vertically.
	int numpix = Width * Height + (1 << HeightBits) - Height;

	numspans = Width;

	Pixels = new BYTE[numpix];
	memset (Pixels, 0, numpix);

	// Draw the image to the buffer
	for (x = 0; x < Width; ++x)
	{
		BYTE *outtop = Pixels + x*Height;
		const column_t *column = (const column_t *)((const BYTE *)patch + LittleLong(patch->columnofs[x]));
		int top = -1;

		while (column < maxcol && column->topdelta != 0xFF)
		{
			if (column->topdelta <= top)
			{
				top += column->topdelta;
			}
			else
			{
				top = column->topdelta;
			}

			int len = column->length;
			BYTE *out = outtop + top;

			if (len != 0)
			{
				if (top + len > Height)	// Clip posts that extend past the bottom
				{
					len = Height - top;
				}
				if (len > 0)
				{
					numspans++;

					const BYTE *in = (const BYTE *)column + 3;
					for (int i = 0; i < len; ++i)
					{
						out[i] = remap[in[i]];
					}
				}
			}
			column = (const column_t *)((const BYTE *)column + column->length + 4);
		}
	}
}